

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

size_t NodeSize(nodeclass *Class)

{
  bool bVar1;
  nodeclass *local_30;
  size_t Size;
  nodemeta *m;
  nodeclass *j;
  nodeclass *Class_local;
  
  local_30 = (nodeclass *)0x0;
  m = (nodemeta *)Class;
  if (*(int *)&Class[1].Meta == 0x444f4d4e) {
    Class_local = (nodeclass *)0x58;
  }
  else {
    for (; m != (nodemeta *)0x0 && local_30 == (nodeclass *)0x0; m = (nodemeta *)m[1].Data) {
      Size = m->Data;
      while( true ) {
        bVar1 = false;
        if (Size != 0) {
          bVar1 = (*(uint *)Size & 0xff) != 0;
        }
        if (!bVar1) goto LAB_0010a7d7;
        if ((*(uint *)Size & 0xff) == 10) break;
        Size = Size + 0x10;
      }
      local_30 = *(nodeclass **)(Size + 8);
LAB_0010a7d7:
    }
    Class_local = local_30;
  }
  return (size_t)Class_local;
}

Assistant:

static NOINLINE size_t NodeSize(const nodeclass* Class)
{
    const nodeclass *j;
    const nodemeta* m;
    size_t Size = 0;

    if (NodeClass_ClassId(Class) == NODEMODULE_CLASS)
        return sizeof(nodemodule); // for NodeContext_Done when all classes are already released

    for (j=Class;j && !Size;j=j->ParentClass)
        for (m=j->Meta;m && m->Meta != META_CLASS_PARENT_ID;++m)
            if (m->Meta == META_CLASS_SIZE)
            {
                Size = (size_t)m->Data;
                break;
            }

    return Size;
}